

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O2

void __thiscall
mp::NLFeeder_Easy::
FeedObjGradient<mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,mp::NLFeeder_Easy>>::SingleSparseVecWrtFactory<int,double>>
          (NLFeeder_Easy *this,int param_1,SingleSparseVecWrtFactory<int,_double> *svwf)

{
  double *pdVar1;
  int j;
  size_type __n;
  double v;
  reference rVar2;
  SparseVectorWriter<int,_double> svw;
  SparseVectorWriter<int,_double> SStack_38;
  
  if ((this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_obj_nonzeros != 0) {
    NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_>::
    SingleSparseVecWrtFactory<int,_double>::MakeVectorWriter
              ((SingleSparseVecWrtFactory<int,_double> *)&SStack_38,(size_t)svwf);
    pdVar1 = (this->nlme_).obj_c_;
    for (__n = 0; (long)__n <
                  (long)(this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_vars;
        __n = __n + 1) {
      rVar2 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->obj_grad_supp_,__n);
      if ((*rVar2._M_p & rVar2._M_mask) != 0) {
        if (pdVar1 == (double *)0x0) {
          v = 0.0;
        }
        else {
          v = pdVar1[__n];
        }
        NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_>::
        SparseVectorWriter<int,_double>::Write
                  (&SStack_38,
                   (this->var_perm_).
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[__n].first,v);
      }
    }
  }
  return;
}

Assistant:

void FeedObjGradient(int , ObjGradWriterFactory& svwf) {
    if (header_.num_obj_nonzeros) {
      auto svw = svwf.MakeVectorWriter(header_.num_obj_nonzeros);
      auto c = NLME().ObjCoefficients();
      for (int j=0; j<header_.num_vars; ++j)
        if (obj_grad_supp_[j])
          svw.Write(VPerm(j), c ? c[j] : 0.0);
    }
  }